

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

longdouble * __thiscall
baryonyx::linearize<long,long_double>
          (longdouble *__return_storage_ptr__,baryonyx *this,long p1x,longdouble p1y,long p2x,
          longdouble p2y,long value)

{
  undefined1 auVar1 [16];
  longdouble *in_RAX;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 in_XMM2_Qa;
  undefined1 auVar4 [16];
  
  if ((long)__return_storage_ptr__ - (long)this != 0) {
    auVar2._0_8_ = (double)(p1y - p2y) / (double)((long)__return_storage_ptr__ - (long)this);
    auVar2._8_8_ = 0;
    auVar3._0_8_ = (double)(long)this;
    auVar3._8_8_ = in_XMM2_Qa;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (double)p2y;
    auVar1 = vfnmadd213sd_fma(auVar3,auVar2,auVar1);
    auVar4._0_8_ = (double)p1x;
    auVar4._8_8_ = in_XMM2_Qa;
    auVar1 = vfmadd213sd_fma(auVar4,auVar2,auVar1);
    vroundsd_avx(auVar1,auVar1,10);
    return in_RAX;
  }
  details::fail_fast("Precondition","p1x - p2x != 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/utils.hpp"
                     ,"152");
}

Assistant:

constexpr Ytype
linearize(Xtype p1x, Ytype p1y, Xtype p2x, Ytype p2y, Xtype value) noexcept
{
    bx_expects(p1x - p2x != 0);

    auto m = static_cast<double>(p1y - p2y) / static_cast<double>(p1x - p2x);
    auto p = static_cast<double>(p2y) - m * static_cast<double>(p2x);

    return static_cast<Ytype>(std::ceil(m * static_cast<double>(value) + p));
}